

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O2

SectionNode * __thiscall
asmjit::v1_14::ZoneAllocator::
newT<asmjit::v1_14::SectionNode,asmjit::v1_14::BaseBuilder*,unsigned_int&>
          (ZoneAllocator *this,BaseBuilder **args,uint *args_1)

{
  uint uVar1;
  BaseBuilder *pBVar2;
  SectionNode *pSVar3;
  
  pSVar3 = (SectionNode *)alloc(this,0x40);
  if (pSVar3 != (SectionNode *)0x0) {
    pBVar2 = *args;
    uVar1 = *args_1;
    *(undefined8 *)pSVar3 = 0;
    *(undefined8 *)(pSVar3 + 8) = 0;
    pSVar3[0x10] = (SectionNode)0x2;
    pSVar3[0x11] = (SectionNode)(pBVar2->_nodeFlags | kHasNoEffect);
    *(undefined8 *)(pSVar3 + 0x12) = 0;
    *(undefined8 *)(pSVar3 + 0x1a) = 0;
    *(undefined8 *)(pSVar3 + 0x20) = 0;
    *(undefined8 *)(pSVar3 + 0x28) = 0;
    *(uint *)(pSVar3 + 0x30) = uVar1;
    *(undefined8 *)(pSVar3 + 0x38) = 0;
  }
  return pSVar3;
}

Assistant:

inline T* newT(Args&&... args) noexcept {
    void* p = allocT<T>();
    if (ASMJIT_UNLIKELY(!p))
      return nullptr;
    return new(Support::PlacementNew{p}) T(std::forward<Args>(args)...);
  }